

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.c
# Opt level: O2

char * stripbrackets(char *string)

{
  size_t sVar1;
  char *pcVar2;
  
  if (((string != (char *)0x0) && (*string == '[')) &&
     (sVar1 = strlen(string), pcVar2 = string, string[sVar1 - 1] == ']')) {
    for (; pcVar2[1] != ']'; pcVar2 = pcVar2 + 1) {
      *pcVar2 = pcVar2[1];
    }
    *pcVar2 = '\0';
  }
  return string;
}

Assistant:

char *stripbrackets(char *string) {
  if (!string)
    return NULL;
  char *ptr = string, *buffer = string;
  size_t length = strlen(string) - 1;
  if (*string == '[' && string[length] == ']') {
    while (*(++string) != ']') { *buffer++ = *string; }
    *buffer = 0;
  }
  return ptr;
}